

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O1

void __thiscall PrintfTest_MinusFlag_Test::TestBody(PrintfTest_MinusFlag_Test *this)

{
  bool bVar1;
  char *pcVar2;
  string_view format;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  internal local_2e0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d8;
  undefined1 local_2d0 [32];
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  local_2b0;
  string local_278;
  char *local_258 [2];
  undefined1 local_248 [32];
  char local_228 [504];
  
  format.size_ = 4;
  format.data_ = "%-5s";
  test_sprintf<char[4]>((string *)local_248,format,(char (*) [4])0x207ca5);
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_2b0,"\"abc  \"","test_sprintf(\"%-5s\", \"abc\")",
             (char (*) [6])"abc  ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248);
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_);
  }
  if (local_2b0.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.format_str_.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_248._0_8_ + 0x10),"format: ",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_248._0_8_ + 0x10),"%-5s",4)
    ;
    if ((undefined8 *)
        local_2b0.
        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
        .parse_context_.format_str_.size_ == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_2b0.
                         super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
                         .parse_context_.format_str_.size_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x9d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2d0,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2d0);
    if ((undefined **)local_248._0_8_ != (undefined **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((undefined **)local_248._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_248._0_8_ + 8))();
      }
      local_248._0_8_ = (undefined **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2b0.
            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
            .parse_context_.format_str_.size_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  format_00.size_ = 4;
  format_00.data_ = "%-5s";
  make_positional_abi_cxx11_(&local_278,format_00);
  local_258[0] = "abc";
  local_248._16_8_ = 0;
  local_248._0_8_ = &PTR_grow_00240f40;
  local_248._24_8_ = 500;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.data_ = local_278._M_dataplus._M_p;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.size_ = local_278._M_string_length;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.next_arg_id_ = 0;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,char[4]>
       ::TYPES;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .loc_.locale_ = (void *)0x0;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .out_.container = (basic_buffer<char> *)local_248;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.field_1.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
        *)local_258;
  local_248._8_8_ = local_228;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format(&local_2b0);
  local_2d0._0_8_ = (AssertHelperData *)(local_2d0 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d0,local_248._8_8_,(char *)(local_248._8_8_ + local_248._16_8_));
  local_248._0_8_ = &PTR_grow_00240f40;
  if ((char *)local_248._8_8_ != local_228) {
    operator_delete((void *)local_248._8_8_);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            (local_2e0,"\"abc  \"","fmt::sprintf(make_positional(\"%-5s\"), \"abc\")",
             (char (*) [6])"abc  ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0);
  if ((AssertHelperData *)local_2d0._0_8_ != (AssertHelperData *)(local_2d0 + 0x10)) {
    operator_delete((void *)local_2d0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if (local_2e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if (local_2d8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_2d8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x9d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2b0,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b0);
    if ((undefined **)local_248._0_8_ != (undefined **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((undefined **)local_248._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_248._0_8_ + 8))();
      }
      local_248._0_8_ = (undefined **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  format_01.size_ = 6;
  format_01.data_ = "%0--5s";
  test_sprintf<char[4]>((string *)local_248,format_01,(char (*) [4])0x207ca5);
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_2b0,"\"abc  \"","test_sprintf(\"%0--5s\", \"abc\")",
             (char (*) [6])"abc  ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248);
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_);
  }
  if (local_2b0.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.format_str_.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_248._0_8_ + 0x10),"format: ",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_248._0_8_ + 0x10),"%0--5s",6);
    if ((undefined8 *)
        local_2b0.
        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
        .parse_context_.format_str_.size_ == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_2b0.
                         super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
                         .parse_context_.format_str_.size_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x9e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2d0,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2d0);
    if ((undefined **)local_248._0_8_ != (undefined **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((undefined **)local_248._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_248._0_8_ + 8))();
      }
      local_248._0_8_ = (undefined **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2b0.
            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
            .parse_context_.format_str_.size_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  format_02.size_ = 6;
  format_02.data_ = "%0--5s";
  make_positional_abi_cxx11_(&local_278,format_02);
  local_258[0] = "abc";
  local_248._16_8_ = 0;
  local_248._0_8_ = &PTR_grow_00240f40;
  local_248._24_8_ = 500;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.data_ = local_278._M_dataplus._M_p;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.size_ = local_278._M_string_length;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.next_arg_id_ = 0;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,char[4]>
       ::TYPES;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .loc_.locale_ = (void *)0x0;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .out_.container = (basic_buffer<char> *)local_248;
  local_2b0.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.field_1.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
        *)local_258;
  local_248._8_8_ = local_228;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format(&local_2b0);
  local_2d0._0_8_ = (AssertHelperData *)(local_2d0 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d0,local_248._8_8_,(char *)(local_248._8_8_ + local_248._16_8_));
  local_248._0_8_ = &PTR_grow_00240f40;
  if ((char *)local_248._8_8_ != local_228) {
    operator_delete((void *)local_248._8_8_);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            (local_2e0,"\"abc  \"","fmt::sprintf(make_positional(\"%0--5s\"), \"abc\")",
             (char (*) [6])"abc  ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0);
  if ((AssertHelperData *)local_2d0._0_8_ != (AssertHelperData *)(local_2d0 + 0x10)) {
    operator_delete((void *)local_2d0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if (local_2e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if (local_2d8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_2d8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x9e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2b0,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b0);
    if ((undefined **)local_248._0_8_ != (undefined **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((undefined **)local_248._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_248._0_8_ + 8))();
      }
      local_248._0_8_ = (undefined **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(PrintfTest, MinusFlag) {
  EXPECT_PRINTF("abc  ", "%-5s", "abc");
  EXPECT_PRINTF("abc  ", "%0--5s", "abc");
}